

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,cmLocalGenerator *lg)

{
  cmTarget *this_00;
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  bool local_13a;
  string local_128 [8];
  string namespacedTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Self local_c8;
  _Self local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  cmValue local_80;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> *local_78;
  cmFindPackageStack *pkgStack;
  cmGeneratorTarget *local_60;
  cmGeneratorTarget *tgt;
  TargetOrString resolved;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  string *input_local;
  cmExportFileGenerator *this_local;
  
  resolved.Target = (cmGeneratorTarget *)lg;
  cmGeneratorTarget::ResolveTargetReference((TargetOrString *)&tgt,target,input,lg);
  local_60 = (cmGeneratorTarget *)resolved.String.field_2._8_8_;
  if (resolved.String.field_2._8_8_ == 0) {
    std::__cxx11::string::operator=((string *)input,(string *)&tgt);
    this_local._7_1_ = false;
  }
  else {
    local_78 = &cmTarget::GetFindPackageStack(*(cmTarget **)resolved.String.field_2._8_8_)->
                super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>;
    local_a2 = 0;
    local_a3 = 0;
    bVar1 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty(local_78);
    local_13a = true;
    if (bVar1) {
      this_00 = local_60->Target;
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"EXPORT_FIND_PACKAGE_NAME",&local_a1);
      local_a3 = 1;
      local_80 = cmTarget::GetProperty(this_00,&local_a0);
      local_13a = cmValue::operator_cast_to_bool(&local_80);
    }
    if ((local_a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if ((local_a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_a1);
    }
    if (local_13a != false) {
      pVar4 = std::
              set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::emplace<cmGeneratorTarget*&>
                        ((set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                          *)&this->ExternalTargets,&local_60);
      local_b8 = (_Base_ptr)pVar4.first._M_node;
      local_b0 = pVar4.second;
    }
    bVar1 = cmGeneratorTarget::IsImported(local_60);
    if (bVar1) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_60);
      std::__cxx11::string::operator=((string *)input,(string *)psVar3);
      this_local._7_1_ = true;
    }
    else {
      local_c0._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::find(&this->ExportedTargets,&local_60);
      local_c8._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::end(&this->ExportedTargets);
      bVar1 = std::operator!=(&local_c0,&local_c8);
      if (bVar1) {
        cmGeneratorTarget::GetExportName_abi_cxx11_
                  ((string *)((long)&namespacedTarget.field_2 + 8),local_60);
        std::operator+(&local_e8,&this->Namespace,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&namespacedTarget.field_2 + 8));
        std::__cxx11::string::operator=((string *)input,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)(namespacedTarget.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::string(local_128);
        (*this->_vptr_cmExportFileGenerator[0xf])(this,local_128,target,local_60);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator=((string *)input,local_128);
        }
        else {
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_60);
          std::__cxx11::string::operator=((string *)input,(string *)psVar3);
        }
        std::__cxx11::string::~string(local_128);
      }
      this_local._7_1_ = true;
    }
  }
  pkgStack._0_4_ = 1;
  cmGeneratorTarget::TargetOrString::~TargetOrString((TargetOrString *)&tgt);
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(std::string& input,
                                               cmGeneratorTarget const* target,
                                               cmLocalGenerator const* lg)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input, lg);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  cmFindPackageStack const& pkgStack = tgt->Target->GetFindPackageStack();
  if (!pkgStack.Empty() ||
      tgt->Target->GetProperty("EXPORT_FIND_PACKAGE_NAME")) {
    this->ExternalTargets.emplace(tgt);
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}